

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall llvm::detail::IEEEFloat::mod(IEEEFloat *this,IEEEFloat *rhs)

{
  bool bVar1;
  bool bVar2;
  cmpResult cVar3;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  IEEEFloat local_80;
  IEEEFloat local_68;
  IEEEFloat local_50;
  undefined1 local_38 [8];
  IEEEFloat V;
  uint origSign;
  opStatus fs;
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  V._20_4_ = modSpecials(this,rhs);
  V._16_4_ = ZEXT14((byte)this->field_0x12 >> 3 & 1);
  while( true ) {
    bVar1 = isFiniteNonZero(this);
    bVar2 = false;
    if (bVar1) {
      bVar1 = isFiniteNonZero(rhs);
      bVar2 = false;
      if (bVar1) {
        cVar3 = compareAbsoluteValue(this,rhs);
        bVar2 = cVar3 != cmpLessThan;
      }
    }
    if (!bVar2) break;
    IEEEFloat(&local_50,rhs);
    ilogb(__x);
    ilogb(__x_00);
    scalbn(__x_01,(int)local_38);
    ~IEEEFloat(&local_50);
    cVar3 = compareAbsoluteValue(this,(IEEEFloat *)local_38);
    if (cVar3 == cmpLessThan) {
      IEEEFloat(&local_80,(IEEEFloat *)local_38);
      scalbn(__x_02,(int)&local_68);
      operator=((IEEEFloat *)local_38,&local_68);
      ~IEEEFloat(&local_68);
      ~IEEEFloat(&local_80);
    }
    V.significand.part._2_1_ =
         V.significand.part._2_1_ & 0xf7 | ((byte)this->field_0x12 >> 3 & 1) << 3;
    V._20_4_ = subtract(this,(IEEEFloat *)local_38,rmNearestTiesToEven);
    if (V._20_4_ != opOK) {
      __assert_fail("fs==opOK",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x6df,"IEEEFloat::opStatus llvm::detail::IEEEFloat::mod(const IEEEFloat &)");
    }
    ~IEEEFloat((IEEEFloat *)local_38);
  }
  bVar2 = isZero(this);
  if (bVar2) {
    this->field_0x12 = this->field_0x12 & 0xf7 | ((byte)V.exponent & 1) << 3;
  }
  return V._20_4_;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::mod(const IEEEFloat &rhs) {
  opStatus fs;
  fs = modSpecials(rhs);
  unsigned int origSign = sign;

  while (isFiniteNonZero() && rhs.isFiniteNonZero() &&
         compareAbsoluteValue(rhs) != cmpLessThan) {
    IEEEFloat V = scalbn(rhs, ilogb(*this) - ilogb(rhs), rmNearestTiesToEven);
    if (compareAbsoluteValue(V) == cmpLessThan)
      V = scalbn(V, -1, rmNearestTiesToEven);
    V.sign = sign;

    fs = subtract(V, rmNearestTiesToEven);
    assert(fs==opOK);
  }
  if (isZero())
    sign = origSign; // fmod requires this
  return fs;
}